

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_search_localfile
              (char **searchpaths,int cwd,char *name,char *revision,char **localfile,
              LYS_INFORMAT *format)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ly_set *set;
  size_t __n;
  lys_node *__name;
  long lVar5;
  DIR *__dirp;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  dirent *pdVar9;
  size_t sVar10;
  char *pcVar11;
  undefined4 uVar12;
  ulong uVar13;
  undefined1 local_128 [8];
  stat st;
  long local_60;
  undefined4 local_4c;
  int local_44;
  char *local_40;
  char *local_38;
  char *wn;
  
  local_38 = (char *)0x0;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_search_localfile");
    return 1;
  }
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_search_localfile")
    ;
    return 1;
  }
  iVar4 = 1;
  st.__glibc_reserved[2] = (__syscall_slong_t)format;
  __n = strlen(name);
  if (cwd == 0) {
    local_44 = 0;
  }
  else {
    __name = (lys_node *)get_current_dir_name();
    if (__name == (lys_node *)0x0) {
LAB_0015887c:
      __name = (lys_node *)0x0;
      iVar4 = 1;
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_search_localfile");
      __dirp = (DIR *)0x0;
      goto LAB_001588c3;
    }
    __dirp = (DIR *)0x0;
    iVar2 = ly_set_add(set,__name,0);
    local_44 = iVar4;
    if (iVar2 == -1) goto LAB_001588c3;
  }
  if (searchpaths != (char **)0x0) {
    __dirp = (DIR *)0x0;
    for (; pcVar7 = *searchpaths, pcVar7 != (char *)0x0; searchpaths = searchpaths + 1) {
      if ((local_44 == 0) || (iVar2 = strcmp((char *)*(set->set).s,pcVar7), iVar2 != 0)) {
        __name = (lys_node *)strdup(pcVar7);
        if (__name == (lys_node *)0x0) goto LAB_0015887c;
        iVar2 = ly_set_add(set,__name,0);
        if (iVar2 == -1) goto LAB_001588c3;
      }
      else {
        local_44 = 0;
      }
    }
  }
  lVar5 = __n + 1;
  __name = (lys_node *)0x0;
  __dirp = (DIR *)0x0;
  local_60 = 0;
  local_40 = (char *)0x0;
  local_4c = 0;
  while (set->number != 0) {
    free(__name);
    free(local_38);
    local_38 = (char *)0x0;
    uVar3 = set->number - 1;
    set->number = uVar3;
    __name = (set->set).s[uVar3];
    (set->set).s[uVar3] = (lys_node *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in %s.",name,__name);
    if (__dirp != (DIR *)0x0) {
      closedir(__dirp);
    }
    __dirp = opendir((char *)__name);
    if (__dirp == (DIR *)0x0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
             "Unable to open directory \"%s\" for searching (sub)modules (%s).",__name,pcVar7);
    }
    else {
      sVar8 = strlen((char *)__name);
LAB_001585f5:
      pdVar9 = readdir(__dirp);
      if (pdVar9 != (dirent *)0x0) {
        if ((byte)pdVar9->d_name[0] == 0x2e) goto code_r0x00158612;
        iVar4 = 0x2e - (uint)(byte)pdVar9->d_name[0];
        goto LAB_00158631;
      }
    }
  }
LAB_001588ab:
  *localfile = local_40;
  if (st.__glibc_reserved[2] != 0) {
    *(undefined4 *)st.__glibc_reserved[2] = local_4c;
  }
  iVar4 = 0;
LAB_001588c3:
  local_40 = (char *)0x0;
LAB_001588c6:
  free(local_38);
  free(__name);
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  free(local_40);
  for (uVar13 = 0; uVar13 < set->number; uVar13 = uVar13 + 1) {
    free((set->set).s[uVar13]);
  }
  ly_set_free(set);
  return iVar4;
code_r0x00158612:
  if (pdVar9->d_name[1] != '\0') {
    uVar3 = (byte)pdVar9->d_name[1] - 0x2e;
    if (uVar3 == 0) {
      uVar3 = (uint)(byte)pdVar9->d_name[2];
    }
    iVar4 = -uVar3;
LAB_00158631:
    if (iVar4 != 0) {
      pcVar7 = pdVar9->d_name;
      free(local_38);
      iVar4 = asprintf(&local_38,"%s/%s",__name,pcVar7);
      if (iVar4 == -1) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_search_localfile");
      }
      else {
        iVar4 = stat(local_38,(stat *)local_128);
        if (iVar4 == -1) {
          piVar6 = __errno_location();
          pcVar11 = strerror(*piVar6);
          ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                 "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                 ,pcVar7,__name,pcVar11);
          goto LAB_001585f5;
        }
        if (((uint)st.st_nlink & 0xf000) == 0x8000) {
          iVar4 = strncmp(name,pcVar7,__n);
          if ((iVar4 == 0) && ((cVar1 = pcVar7[__n], cVar1 == '@' || (cVar1 == '.')))) {
            sVar10 = strlen(pcVar7);
            iVar4 = strcmp(pcVar7 + (sVar10 - 4),".yin");
            uVar12 = 2;
            if ((iVar4 == 0) ||
               (iVar4 = strcmp(pcVar7 + (sVar10 - 5),".yang"), uVar12 = 1, iVar4 == 0)) {
              if (revision == (char *)0x0) {
                if (local_40 != (char *)0x0) {
                  if (cVar1 != '@') goto LAB_001585f5;
                  iVar4 = lyp_check_date((ly_ctx *)0x0,pcVar7 + lVar5);
                  if ((iVar4 != 0) ||
                     ((local_40[local_60] == '@' &&
                      (iVar4 = strncmp(local_40 + local_60 + 1,pcVar7 + lVar5,10), -1 < iVar4))))
                  goto LAB_001585f5;
                  free(local_40);
                }
                local_40 = local_38;
                local_38 = (char *)0x0;
                local_60 = sVar8 + lVar5;
                local_4c = uVar12;
                goto LAB_001585f5;
              }
              if (cVar1 == '@') {
                sVar10 = strlen(revision);
                iVar4 = strncmp(revision,pcVar7 + lVar5,sVar10);
                if (iVar4 == 0) {
                  free(local_40);
                  local_40 = local_38;
                  local_38 = (char *)0x0;
                  local_4c = uVar12;
                  goto LAB_001588ab;
                }
              }
              else {
                free(local_40);
                local_40 = local_38;
                local_38 = (char *)0x0;
                local_60 = sVar8 + lVar5;
                local_4c = uVar12;
              }
            }
          }
          goto LAB_001585f5;
        }
        if ((((uint)st.st_nlink & 0xf000) != 0x4000) || (set->number == 0 && local_44 != 0))
        goto LAB_001585f5;
        iVar4 = ly_set_add(set,local_38,0);
        if (iVar4 != -1) {
          local_38 = (char *)0x0;
          goto LAB_001585f5;
        }
      }
      iVar4 = 1;
      goto LAB_001588c6;
    }
  }
  goto LAB_001585f5;
}

Assistant:

API int
lys_search_localfile(const char * const *searchpaths, int cwd, const char *name, const char *revision, char **localfile, LYS_INFORMAT *format)
{
    size_t len, flen, match_len = 0, dir_len;
    int i, implicit_cwd = 0, ret = EXIT_FAILURE;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    if (!localfile) {
        LOGARG;
        return EXIT_FAILURE;
    }

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM(NULL);
        return EXIT_FAILURE;
    }

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->set.g[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN(NULL, "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && (dirs->number || !implicit_cwd)) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format_aux = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format_aux = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format_aux;
                            goto success;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format_aux;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(NULL, &file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = EXIT_SUCCESS;

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return ret;
}